

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_3,_2,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  float *pfVar2;
  Vector<float,_3> *pVVar3;
  int col;
  long lVar4;
  int row;
  long lVar5;
  long lVar6;
  float v;
  float fVar7;
  undefined4 uVar8;
  Vector<float,_3> res;
  undefined8 local_50;
  undefined4 local_48;
  int local_40 [6];
  Mat3 m;
  
  local_48 = DAT_007a3308;
  local_50 = s_constInVec3;
  pfVar2 = (float *)&m;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar8;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar5 != 3);
  pVVar3 = (Vector<float,_3> *)&m;
  m.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  m.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  m.m_data.m_data[1].m_data[0] = (float)uVar1;
  m.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  m.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
  m.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  m.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar4 = 0;
  do {
    fVar7 = 0.0;
    lVar5 = 0;
    do {
      fVar7 = fVar7 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data[lVar5]
                      * *(float *)((long)&local_50 + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    res.m_data[lVar4] = fVar7;
    lVar4 = lVar4 + 1;
    pVVar3 = pVVar3 + 1;
  } while (lVar4 != 3);
  local_40[2] = 0;
  local_40[3] = 1;
  local_40[4] = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[local_40[lVar4]] = res.m_data[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

inline Vector<T, Size>::Vector (const Vector<T, Size>& v)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = v.m_data[i];
}